

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_UseTraverse(AActor *usething,DVector2 *start,DVector2 *end,bool *foundline)

{
  uint uVar1;
  AActor *thing;
  double dVar2;
  bool bVar3;
  int iVar4;
  intercept_t *in;
  ASectorAction *pAVar5;
  line_t *line;
  TObjPtr<ASectorAction> *obj;
  ASectorAction **obj_00;
  DVector2 local_138;
  FSoundID local_11c;
  DVector3 local_118;
  FPathTraverse it;
  FLineOpening open;
  
  FPathTraverse::FPathTraverse(&it,start->X,start->Y,end->X,end->Y,3,0.0);
  local_118.Z = (usething->__Pos).Z;
  local_118.X = start->X;
  local_118.Y = start->Y;
LAB_004b2160:
  while( true ) {
    do {
      while( true ) {
        in = FPathTraverse::Next(&it);
        if (in == (intercept_t *)0x0) goto LAB_004b239d;
        if (in->isaline != false) break;
        thing = (in->d).thing;
        if ((thing != usething) &&
           (((((thing->flags5).Value & 0x2000) != 0 || (thing->special == 0x81)) &&
            (bVar3 = P_ActivateThingSpecial(thing,usething,false), bVar3)))) goto LAB_004b239d;
      }
      iVar4 = FPathTraverse::PortalRelocate(&it,in,3,&local_118);
    } while (iVar4 != 0);
    line = (in->d).line;
    if ((line->special == 0) || ((line->activation & 0x442) == 0)) break;
    local_138.X = local_118.X;
    local_138.Y = local_118.Y;
    iVar4 = P_PointOnLineSide(&local_138,line);
    line = (in->d).line;
    if (iVar4 == 1) {
      if ((line->activation >> 10 & 1) == 0) break;
      P_ActivateLine(line,usething,1,0x400,&local_118);
      goto LAB_004b239d;
    }
    if ((line->activation & 0x442) == 0x400) break;
    P_ActivateLine(line,usething,0,2,&local_118);
    uVar1 = ((in->d).line)->activation;
    if (((uint)i_compatflags >> 8 & 1) == 0) {
      if ((uVar1 & 2) != 0) goto LAB_004b239d;
    }
    else if ((uVar1 & 0x40) == 0) {
LAB_004b239d:
      FPathTraverse::~FPathTraverse(&it);
      return in != (intercept_t *)0x0;
    }
  }
  if ((line->flags & 0x2008000) == 0) {
    local_138.X = in->frac * it.trace.dx + it.trace.x;
    local_138.Y = in->frac * it.trace.dy + it.trace.y;
    P_LineOpening(&open,(AActor *)0x0,line,&local_138,(DVector2 *)0x0,0);
    if ((0.0 < open.range) && ((((in->d).line)->special == 0 || ((i_compatflags & 0x100U) == 0)))) {
      *foundline = true;
      goto LAB_004b2160;
    }
  }
  else {
    open.range = 0.0;
  }
  obj = &usething->Sector->SecActTarget;
  pAVar5 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
  if (pAVar5 != (ASectorAction *)0x0) {
    pAVar5 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
    bVar3 = ASectorAction::TriggerAction(pAVar5,usething,0x10);
    if (bVar3) goto LAB_004b239d;
  }
  local_138.X = local_118.X;
  local_138.Y = local_118.Y;
  iVar4 = P_PointOnLineSide(&local_138,(in->d).line);
  dVar2 = (&((in->d).thing)->SpriteAngle)[iVar4 != 0].Degrees;
  if (dVar2 != 0.0) {
    obj_00 = (ASectorAction **)((long)dVar2 + 0x1e8);
    pAVar5 = GC::ReadBarrier<ASectorAction>(obj_00);
    if (pAVar5 != (ASectorAction *)0x0) {
      pAVar5 = GC::ReadBarrier<ASectorAction>(obj_00);
      bVar3 = ASectorAction::TriggerAction(pAVar5,usething,0x20);
      if (bVar3) goto LAB_004b239d;
    }
  }
  if (usething->player != (player_t *)0x0) {
    local_11c.ID = S_FindSound("*usefail");
    S_Sound(usething,2,&local_11c,1.0,1.001);
  }
  goto LAB_004b239d;
}

Assistant:

bool P_UseTraverse(AActor *usething, const DVector2 &start, const DVector2 &end, bool &foundline)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES | PT_ADDTHINGS);
	intercept_t *in;
	DVector3 xpos = { start.X, start.Y, usething->Z() };

	while ((in = it.Next()))
	{
		// [RH] Check for things to talk with or use a puzzle item on
		if (!in->isaline)
		{
			if (usething == in->d.thing)
				continue;
			// Check thing

			// Check for puzzle item use or USESPECIAL flag
			// Extended to use the same activationtype mechanism as BUMPSPECIAL does
			if (in->d.thing->flags5 & MF5_USESPECIAL || in->d.thing->special == UsePuzzleItem)
			{
				if (P_ActivateThingSpecial(in->d.thing, usething))
					return true;
			}
			continue;
		}

		if (it.PortalRelocate(in, PT_ADDLINES | PT_ADDTHINGS, &xpos))
		{
			continue;
		}

		FLineOpening open;
		if (in->d.line->special == 0 || !(in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)))
		{
		blocked:
			if (in->d.line->flags & (ML_BLOCKEVERYTHING | ML_BLOCKUSE))
			{
				open.range = 0;
			}
			else
			{
				P_LineOpening(open, NULL, in->d.line, it.InterceptPoint(in));
			}
			if (open.range <= 0 ||
				(in->d.line->special != 0 && (i_compatflags & COMPATF_USEBLOCKING)))
			{
				// [RH] Give sector a chance to intercept the use

				sector_t * sec;

				sec = usething->Sector;

				if (sec->SecActTarget && sec->SecActTarget->TriggerAction(usething, SECSPAC_Use))
				{
					return true;
				}

				sec = P_PointOnLineSide(xpos, in->d.line) == 0 ?
					in->d.line->frontsector : in->d.line->backsector;

				if (sec != NULL && sec->SecActTarget &&
					sec->SecActTarget->TriggerAction(usething, SECSPAC_UseWall))
				{
					return true;
				}

				if (usething->player)
				{
					S_Sound(usething, CHAN_VOICE, "*usefail", 1, ATTN_IDLE);
				}
				return true;		// can't use through a wall
			}
			foundline = true;
			continue;			// not a special line, but keep checking
		}

		if (P_PointOnLineSide(xpos, in->d.line) == 1)
		{
			if (!(in->d.line->activation & SPAC_UseBack))
			{
				// [RH] continue traversal for two-sided lines
				//return in->d.line->backsector != NULL;		// don't use back side
				goto blocked;	// do a proper check for back sides of triggers
			}
			else
			{
				P_ActivateLine(in->d.line, usething, 1, SPAC_UseBack, &xpos);
				return true;
			}
		}
		else
		{
			if ((in->d.line->activation & (SPAC_Use | SPAC_UseThrough | SPAC_UseBack)) == SPAC_UseBack)
			{
				goto blocked; // Line cannot be used from front side so treat it as a non-trigger line
			}

			P_ActivateLine(in->d.line, usething, 0, SPAC_Use, &xpos);

			//WAS can't use more than one special line in a row
			//jff 3/21/98 NOW multiple use allowed with enabling line flag
			//[RH] And now I've changed it again. If the line is of type
			//	   SPAC_USE, then it eats the use. Everything else passes
			//	   it through, including SPAC_USETHROUGH.
			if (i_compatflags & COMPATF_USEBLOCKING)
			{
				if (in->d.line->activation & SPAC_UseThrough) continue;
				else return true;
			}
			else
			{
				if (!(in->d.line->activation & SPAC_Use)) continue;
				else return true;
			}

		}

	}
	return false;
}